

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

int server::clientconnect(int n,uint ip,char *ipstr)

{
  uint uVar1;
  int iVar2;
  clientinfo *pcVar3;
  clientinfo *ci;
  string cm;
  clientinfo *local_138;
  stringformatter local_130;
  char local_128 [272];
  
  if (n < 0x80) {
    pcVar3 = (clientinfo *)getclientinfo(n);
  }
  else if ((int)(n - 0x80U) < DAT_00193cd4) {
    pcVar3 = *(clientinfo **)(bots + (ulong)(n - 0x80U) * 8);
  }
  else {
    pcVar3 = (clientinfo *)0x0;
  }
  pcVar3->ip = ipstr;
  local_130.buf = local_128;
  local_138 = pcVar3;
  stringformatter::operator()(&local_130,"IP: %s",ipstr);
  if (showclientips != 0) {
    privilegemsg(3,local_128);
  }
  pcVar3->ownernum = n;
  pcVar3->clientnum = n;
  pcVar3->connectmillis = totalmillis;
  uVar1 = randomMT();
  pcVar3->sessionid = (totalmillis % 10000 + 1) * uVar1 & 0xffffff;
  vector<server::clientinfo_*>::add((vector<server::clientinfo_*> *)&connects,&local_138);
  if (local_138->isSpecLocked == true) {
    forcespectator(local_138);
  }
  if (local_138->votedmapsucks == true) {
    local_138->votedmapsucks = true;
  }
  iVar2 = 2;
  if (gamemode < 0x17) {
    sendservinfo(local_138);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int clientconnect(int n, uint ip, char *ipstr)
    {
        clientinfo *ci = getinfo(n);
        ci->ip=ipstr; //QServ ci->ip
        defformatstring(cm)("IP: %s", ci->ip);
        if(showclientips) privilegemsg(PRIV_ADMIN, cm);
        ci->clientnum = ci->ownernum = n;
        ci->connectmillis = totalmillis;
        ci->sessionid = (rnd(0x1000000)*((totalmillis%10000)+1))&0xFFFFFF;
        connects.add(ci);
        if(ci->isSpecLocked) forcespectator(ci);
        if(ci->votedmapsucks) ci->votedmapsucks = true;
        if(!m_mp(gamemode)) return DISC_LOCAL;
        sendservinfo(ci);
        return DISC_NONE;
    }